

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builtin.c
# Opt level: O3

SchemeObject * SubProcedure(SchemeObject *arguments)

{
  char cVar1;
  SchemeObject *pSVar2;
  SchemeObject *pSVar3;
  double local_18;
  
  pSVar2 = Car(arguments);
  cVar1 = IsFixnum(pSVar2);
  pSVar2 = Car(arguments);
  if (cVar1 != '\0') {
    pSVar2 = (pSVar2->data).pair.car;
    while( true ) {
      arguments = Cdr(arguments);
      cVar1 = IsTheEmptyList(arguments);
      if (cVar1 != '\0') break;
      pSVar3 = Car(arguments);
      pSVar2 = (SchemeObject *)((long)pSVar2 - (long)(pSVar3->data).pair.car);
    }
    pSVar2 = MakeFixnum((long)pSVar2);
    return pSVar2;
  }
  local_18 = *(double *)&pSVar2->data;
  while( true ) {
    arguments = Cdr(arguments);
    cVar1 = IsTheEmptyList(arguments);
    if (cVar1 != '\0') break;
    pSVar2 = Car(arguments);
    local_18 = local_18 - *(double *)&pSVar2->data;
  }
  pSVar2 = MakeFloatnum(local_18);
  return pSVar2;
}

Assistant:

static SchemeObject*
SubProcedure(SchemeObject* arguments) /* (- ...) */
{
    if (IsFixnum(Car(arguments))) {
        long result = (Car(arguments))->data.fixnum.value;

        while (!IsTheEmptyList(arguments = Cdr(arguments))) {
            result -= (Car(arguments))->data.fixnum.value;
        }
        return MakeFixnum(result);
    } else {
        double result = (Car(arguments))->data.floatnum.value;

            while (!IsTheEmptyList(arguments = Cdr(arguments))) {
                result -= (Car(arguments))->data.floatnum.value;
            }
        return MakeFloatnum(result);
    }
}